

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O3

Json __thiscall json11::anon_unknown_22::JsonParser::parse_json(JsonParser *this,int depth)

{
  size_t sVar1;
  pointer pcVar2;
  double value;
  __shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined8 uVar4;
  undefined8 uVar5;
  byte bVar6;
  int iVar8;
  element_type *extraout_RAX;
  element_type *extraout_RAX_00;
  element_type *extraout_RAX_01;
  element_type *extraout_RAX_02;
  char cVar7;
  element_type *extraout_RAX_03;
  mapped_type *pmVar9;
  element_type *extraout_RAX_04;
  size_t sVar10;
  long *plVar11;
  element_type *extraout_RAX_05;
  element_type *extraout_RAX_06;
  element_type *extraout_RAX_07;
  element_type *extraout_RAX_08;
  string *psVar12;
  size_t sVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  char c;
  int in_EDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  size_t sVar16;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_15;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_16;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_17;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_18;
  undefined4 in_register_00000034;
  JsonParser *this_00;
  undefined1 auVar17 [8];
  size_t sVar18;
  bool c_00;
  __shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2> _Var19;
  undefined1 auVar20 [16];
  Json JVar27;
  __shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2> _Var28;
  Json JVar29;
  Json JVar30;
  __shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2> _Var31;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
  data_1;
  vector<json11::Json,_std::allocator<json11::Json>_> data;
  size_type __dnew;
  char buf [12];
  undefined1 local_108 [8];
  undefined1 local_100 [24];
  _Base_ptr local_e8;
  size_t local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [24];
  undefined1 local_b0 [16];
  undefined1 local_a0 [16];
  string local_90;
  Json local_70;
  Json local_60;
  char local_4c [12];
  Json local_40;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var15;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_14;
  
  this_00 = (JsonParser *)CONCAT44(in_register_00000034,depth);
  if (in_EDX < 0xc9) {
    bVar6 = get_next_token(this_00);
    if (this_00->failed == true) {
      Json::Json((Json *)this);
      JVar29.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = extraout_RDX_00._M_pi;
      JVar29.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           extraout_RAX_00;
      return (Json)JVar29.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>;
    }
    c_00 = 9 < (byte)(bVar6 - 0x30);
    if (bVar6 != 0x2d && c_00) {
      if (bVar6 < 0x6e) {
        if (bVar6 == 0x22) {
          (anonymous_namespace)::JsonParser::parse_string_abi_cxx11_((string *)local_108,this_00);
          Json::Json((Json *)this,(string *)local_108);
          local_c8._0_8_ = local_100._8_8_;
          auVar17 = local_108;
          if (local_108 == (undefined1  [8])(local_100 + 8)) {
            auVar20._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_100 + 8);
            auVar20._8_8_ = extraout_RDX_03._M_pi;
            return (Json)auVar20;
          }
          goto LAB_0013a294;
        }
        if (bVar6 == 0x5b) {
          local_d8._0_8_ = (string *)0x0;
          local_d8._8_8_ = (pointer)0x0;
          local_c8._0_8_ = (string *)0x0;
          cVar7 = get_next_token(this_00);
          if (cVar7 != ']') {
            while( true ) {
              this_00->i = this_00->i - 1;
              parse_json((JsonParser *)local_108,depth);
              std::vector<json11::Json,_std::allocator<json11::Json>_>::emplace_back<json11::Json>
                        ((vector<json11::Json,_std::allocator<json11::Json>_> *)local_d8,
                         (Json *)local_108);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._0_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._0_8_);
              }
              if (this_00->failed == true) {
                Json::Json((Json *)this);
                goto LAB_0013ace1;
              }
              cVar7 = get_next_token(this_00);
              if (cVar7 != ',') break;
              get_next_token(this_00);
            }
            if (cVar7 != ']') {
              esc_abi_cxx11_((string *)(local_c8 + 0x18),(json11 *)(ulong)(uint)(int)cVar7,c);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_108,"expected \',\' in list, got ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_c8 + 0x18));
              fail(this,(string *)this_00);
              if (local_108 != (undefined1  [8])(local_100 + 8)) {
                operator_delete((void *)local_108,(ulong)(local_100._8_8_ + 1));
              }
              if ((string *)local_b0._0_8_ != (string *)(local_b0 + 0x10)) {
                operator_delete((void *)local_b0._0_8_,
                                (ulong)((long)&((_Alloc_hider *)local_a0._0_8_)->_M_p + 1));
              }
              goto LAB_0013ace1;
            }
          }
          Json::Json((Json *)this,(array *)local_d8);
LAB_0013ace1:
          std::vector<json11::Json,_std::allocator<json11::Json>_>::~vector
                    ((vector<json11::Json,_std::allocator<json11::Json>_> *)local_d8);
          auVar23._0_8_ = extraout_RAX_08;
          auVar23._8_8_ = extraout_RDX_18._M_pi;
          return (Json)auVar23;
        }
        if (bVar6 == 0x66) {
          local_108 = (undefined1  [8])(local_100 + 8);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"false","");
          Json::Json(&local_70,false);
          _Var19 = (__shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>)
                   expect(this,(string *)this_00,(Json *)local_108);
LAB_0013a4fd:
          if (local_70.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_70.m_ptr.
                       super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi);
            _Var19._M_refcount._M_pi = extraout_RDX_02._M_pi;
            _Var19._M_ptr = extraout_RAX_02;
          }
          goto LAB_0013a286;
        }
      }
      else {
        if (bVar6 == 0x6e) {
          local_108 = (undefined1  [8])(local_100 + 8);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"null","");
          Json::Json(&local_40);
          _Var28 = (__shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>)
                   expect(this,(string *)this_00,(Json *)local_108);
          if (local_40.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_40.m_ptr.
                       super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi);
            _Var28._M_refcount._M_pi = extraout_RDX_04._M_pi;
            _Var28._M_ptr = extraout_RAX_03;
          }
          local_c8._0_8_ = local_100._8_8_;
          auVar17 = local_108;
          if (local_108 == (undefined1  [8])(local_100 + 8)) {
            auVar21._0_8_ = _Var28._M_ptr;
            auVar21._8_8_ = _Var28._M_refcount._M_pi;
            return (Json)auVar21;
          }
          goto LAB_0013a294;
        }
        if (bVar6 == 0x7b) {
          local_100._16_8_ = local_100;
          local_100._0_8_ = local_100._0_8_ & 0xffffffff00000000;
          local_100._8_8_ = 0;
          local_e0 = 0;
          local_e8 = (_Base_ptr)local_100._16_8_;
          bVar6 = get_next_token(this_00);
          _Var15._M_pi = extraout_RDX_06;
          if (bVar6 != 0x7d) {
            do {
              if (bVar6 != 0x22) {
                esc_abi_cxx11_((string *)local_d8,(json11 *)(ulong)(uint)(int)(char)bVar6,
                               (char)_Var15._M_pi);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_c8 + 0x18),"expected \'\"\' in object, got ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_d8);
                fail(this,(string *)this_00);
                if ((string *)local_b0._0_8_ != (string *)(local_b0 + 0x10)) {
                  operator_delete((void *)local_b0._0_8_,
                                  (ulong)((long)&((_Alloc_hider *)local_a0._0_8_)->_M_p + 1));
                }
                if ((string *)local_d8._0_8_ != (string *)(local_d8 + 0x10)) {
                  operator_delete((void *)local_d8._0_8_,(ulong)(local_c8._0_8_ + 1));
                }
                goto LAB_0013abd2;
              }
              (anonymous_namespace)::JsonParser::parse_string_abi_cxx11_
                        ((string *)(local_c8 + 0x18),this_00);
              if (this_00->failed == true) {
                Json::Json((Json *)this);
                iVar8 = 1;
                bVar6 = 0x22;
                _Var15._M_pi = extraout_RDX_07;
              }
              else {
                bVar6 = get_next_token(this_00);
                if (bVar6 == 0x3a) {
                  parse_json((JsonParser *)local_d8,depth);
                  pmVar9 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
                           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
                                         *)local_108,(key_type *)(local_c8 + 0x18));
                  uVar5 = local_d8._8_8_;
                  uVar4 = local_d8._0_8_;
                  local_d8._0_8_ = (string *)0x0;
                  local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var14 = (pmVar9->m_ptr).
                            super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi;
                  (pmVar9->m_ptr).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (element_type *)uVar4;
                  (pmVar9->m_ptr).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
                  if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
                  }
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
                  }
                  if (this_00->failed == true) {
                    Json::Json((Json *)this);
                    iVar8 = 1;
                    bVar6 = 0x3a;
                    _Var15._M_pi = extraout_RDX_08;
                  }
                  else {
                    bVar6 = get_next_token(this_00);
                    if (bVar6 == 0x2c) {
                      bVar6 = get_next_token(this_00);
                      iVar8 = 0;
                      _Var15._M_pi = extraout_RDX_13;
                    }
                    else {
                      iVar8 = 3;
                      _Var15._M_pi = extraout_RDX_09;
                      if (bVar6 != 0x7d) {
                        esc_abi_cxx11_((string *)(local_a0 + 0x10),
                                       (json11 *)(ulong)(uint)(int)(char)bVar6,(char)extraout_RDX_09
                                      );
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_d8,"expected \',\' in object, got ",
                                       (string *)(local_a0 + 0x10));
                        JVar29 = fail(this,(string *)this_00);
                        _Var15._M_pi = JVar29.m_ptr.
                                       super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi;
                        if ((string *)local_d8._0_8_ != (string *)(local_d8 + 0x10))
                        goto LAB_0013a8f8;
                        goto LAB_0013a905;
                      }
                    }
                  }
                }
                else {
                  if ((char)bVar6 < ' ') {
                    snprintf(local_4c,0xc,"(%d)",(ulong)(uint)(int)(char)bVar6);
                  }
                  else {
                    snprintf(local_4c,0xc,"\'%c\' (%d)",(ulong)bVar6,(ulong)bVar6);
                  }
                  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
                  sVar10 = strlen(local_4c);
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)(local_a0 + 0x10),local_4c,local_4c + sVar10);
                  plVar11 = (long *)std::__cxx11::string::replace
                                              ((ulong)(local_a0 + 0x10),0,(char *)0x0,0x15b593);
                  psVar12 = (string *)(plVar11 + 2);
                  if ((string *)*plVar11 == psVar12) {
                    local_c8._0_8_ = (psVar12->_M_dataplus)._M_p;
                    local_c8._8_8_ = plVar11[3];
                    local_d8._0_8_ = (string *)(local_d8 + 0x10);
                  }
                  else {
                    local_c8._0_8_ = (psVar12->_M_dataplus)._M_p;
                    local_d8._0_8_ = (string *)*plVar11;
                  }
                  local_d8._8_8_ = plVar11[1];
                  *plVar11 = (long)psVar12;
                  plVar11[1] = 0;
                  *(undefined1 *)(plVar11 + 2) = 0;
                  JVar29 = fail(this,(string *)this_00);
                  _Var15._M_pi = JVar29.m_ptr.
                                 super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi;
                  if ((string *)local_d8._0_8_ != (string *)(local_d8 + 0x10)) {
LAB_0013a8f8:
                    operator_delete((void *)local_d8._0_8_,(ulong)(local_c8._0_8_ + 1));
                    _Var15._M_pi = extraout_RDX_10;
                  }
LAB_0013a905:
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_90._M_dataplus._M_p != &local_90.field_2) {
                    operator_delete(local_90._M_dataplus._M_p,
                                    local_90.field_2._M_allocated_capacity + 1);
                    _Var15._M_pi = extraout_RDX_11;
                  }
                  iVar8 = 1;
                }
              }
              if ((string *)local_b0._0_8_ != (string *)(local_b0 + 0x10)) {
                operator_delete((void *)local_b0._0_8_,
                                (ulong)((long)&((_Alloc_hider *)local_a0._0_8_)->_M_p + 1));
                _Var15._M_pi = extraout_RDX_12;
              }
            } while (iVar8 == 0);
            if (iVar8 != 3) goto LAB_0013abd2;
          }
          Json::Json((Json *)this,(object *)local_108);
LAB_0013abd2:
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
                       *)local_108);
          auVar22._0_8_ = extraout_RAX_07;
          auVar22._8_8_ = extraout_RDX_17._M_pi;
          return (Json)auVar22;
        }
        if (bVar6 == 0x74) {
          local_108 = (undefined1  [8])(local_100 + 8);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"true","");
          Json::Json(&local_60,true);
          _Var19 = (__shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>)
                   expect(this,(string *)this_00,(Json *)local_108);
          local_70.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               local_60.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          goto LAB_0013a4fd;
        }
      }
      esc_abi_cxx11_((string *)(local_c8 + 0x18),(json11 *)(ulong)(uint)(int)(char)bVar6,c_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                     "expected value, got ",(string *)(local_c8 + 0x18));
      JVar29 = fail(this,(string *)this_00);
      _Var15._M_pi = JVar29.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
      if (local_108 != (undefined1  [8])(local_100 + 8)) {
        operator_delete((void *)local_108,(ulong)(local_100._8_8_ + 1));
        _Var15._M_pi = extraout_RDX_05;
      }
      local_c8._0_8_ = local_a0._0_8_;
      auVar17 = (undefined1  [8])local_b0._0_8_;
      if ((string *)local_b0._0_8_ == (string *)(local_b0 + 0x10)) {
        auVar24._0_8_ = (string *)(local_b0 + 0x10);
        auVar24._8_8_ = _Var15._M_pi;
        return (Json)auVar24;
      }
      goto LAB_0013a294;
    }
    sVar1 = this_00->i;
    sVar16 = sVar1 - 1;
    this_00->i = sVar16;
    pcVar2 = (this_00->str->_M_dataplus)._M_p;
    cVar7 = pcVar2[sVar1 - 1];
    sVar18 = sVar16;
    if (cVar7 == '-') {
      this_00->i = sVar1;
      cVar7 = pcVar2[sVar1];
      sVar18 = sVar1;
    }
    if (cVar7 == '0') {
      sVar13 = sVar18 + 1;
      this_00->i = sVar13;
      bVar6 = pcVar2[sVar18 + 1];
      if ((byte)(bVar6 - 0x30) < 10) {
        local_108 = (undefined1  [8])(local_100 + 8);
        local_b0._0_8_ = (string *)0x23;
        local_108 = (undefined1  [8])
                    std::__cxx11::string::_M_create((ulong *)local_108,(ulong)(local_c8 + 0x18));
        local_100._8_8_ = local_b0._0_8_;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_108 + 0x10))->
        _vptr__Sp_counted_base = (_func_int **)0x64657474696d7265;
        *(undefined8 *)
         &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_108 + 0x10))->_M_use_count =
             0x626d756e206e6920;
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108)->_vptr__Sp_counted_base =
             (_func_int **)0x20676e696461656c;
        *(undefined8 *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108)->_M_use_count =
             0x7020746f6e207330;
        *(undefined4 *)
         ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_108 + 0x10))->
                 _M_weak_count + 3) = 0x73726562;
        local_100._0_8_ = local_b0._0_8_;
        *(undefined1 *)
         ((long)&((_Alloc_hider *)local_b0._0_8_)->_M_p +
         (long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108)->_vptr__Sp_counted_base)
             = 0;
        _Var19 = (__shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>)
                 fail(this,(string *)this_00);
        goto LAB_0013a286;
      }
    }
    else {
      if (8 < (byte)(cVar7 - 0x31U)) {
        if (cVar7 < ' ') {
          snprintf(local_a0 + 0x10,0xc,"(%d)",(ulong)(uint)(int)cVar7);
        }
        else {
          snprintf(local_a0 + 0x10,0xc,"\'%c\' (%d)",cVar7,cVar7);
        }
        local_d8._0_8_ = (string *)(local_d8 + 0x10);
        sVar10 = strlen(local_a0 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_d8,local_a0 + 0x10,local_a0 + sVar10 + 0x10);
        plVar11 = (long *)std::__cxx11::string::replace((ulong)local_d8,0,(char *)0x0,0x15b639);
        psVar12 = (string *)(plVar11 + 2);
        if ((string *)*plVar11 == psVar12) {
          local_a0._0_8_ = (psVar12->_M_dataplus)._M_p;
          local_a0._8_8_ = plVar11[3];
          local_b0._0_8_ = (string *)(local_b0 + 0x10);
        }
        else {
          local_a0._0_8_ = (psVar12->_M_dataplus)._M_p;
          local_b0._0_8_ = (string *)*plVar11;
        }
        local_b0._8_8_ = plVar11[1];
        *plVar11 = (long)psVar12;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append(local_c8 + 0x18);
        p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar11 + 2);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar11 == p_Var14) {
          local_100._8_8_ = p_Var14->_vptr__Sp_counted_base;
          local_100._16_8_ = plVar11[3];
          local_108 = (undefined1  [8])(local_100 + 8);
        }
        else {
          local_100._8_8_ = p_Var14->_vptr__Sp_counted_base;
          local_108 = (undefined1  [8])*plVar11;
        }
        local_100._0_8_ = plVar11[1];
        *plVar11 = (long)p_Var14;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        _Var31 = (__shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>)
                 fail(this,(string *)this_00);
        if (local_108 != (undefined1  [8])(local_100 + 8)) {
          operator_delete((void *)local_108,(ulong)(local_100._8_8_ + 1));
          _Var31._M_refcount._M_pi = extraout_RDX_15._M_pi;
          _Var31._M_ptr = extraout_RAX_05;
        }
        if ((string *)local_b0._0_8_ != (string *)(local_b0 + 0x10)) {
          operator_delete((void *)local_b0._0_8_,
                          (ulong)((long)&((_Alloc_hider *)local_a0._0_8_)->_M_p + 1));
          _Var31._M_refcount._M_pi = extraout_RDX_16._M_pi;
          _Var31._M_ptr = extraout_RAX_06;
        }
        auVar17 = (undefined1  [8])local_d8._0_8_;
        if ((string *)local_d8._0_8_ == (string *)(local_d8 + 0x10)) {
          auVar25._0_8_ = _Var31._M_ptr;
          auVar25._8_8_ = _Var31._M_refcount._M_pi;
          return (Json)auVar25;
        }
        goto LAB_0013a294;
      }
      do {
        sVar13 = sVar18 + 1;
        this_00->i = sVar13;
        bVar6 = pcVar2[sVar18 + 1];
        sVar18 = sVar13;
      } while ((byte)(bVar6 - 0x30) < 10);
    }
    if (bVar6 == 0x2e) {
      this_00->i = sVar13 + 1;
      if (9 < (byte)(pcVar2[sVar13 + 1] - 0x30U)) {
        local_108 = (undefined1  [8])(local_100 + 8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_108,"at least one digit required in fractional part","");
        _Var19 = (__shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>)
                 fail(this,(string *)this_00);
        goto LAB_0013a286;
      }
      sVar16 = sVar13 + 2;
      do {
        sVar13 = sVar16;
        this_00->i = sVar13;
        bVar6 = pcVar2[sVar13];
        sVar16 = sVar13 + 1;
      } while ((byte)(bVar6 - 0x30) < 10);
    }
    else if (((bVar6 != 0x45) && (bVar6 != 0x65)) && (sVar13 - sVar16 < 10)) {
      iVar8 = atoi(pcVar2 + (sVar1 - 1));
      Json::Json((Json *)this,iVar8);
      JVar27.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = extraout_RDX_01._M_pi;
      JVar27.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           extraout_RAX_01;
      return (Json)JVar27.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>;
    }
    if ((bVar6 | 0x20) != 0x65) {
LAB_0013a9ec:
      value = strtod(pcVar2 + (sVar1 - 1),(char **)0x0);
      Json::Json((Json *)this,value);
      JVar30.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = extraout_RDX_14._M_pi;
      JVar30.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           extraout_RAX_04;
      return (Json)JVar30.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>;
    }
    sVar16 = sVar13 + 1;
    this_00->i = sVar16;
    cVar7 = pcVar2[sVar13 + 1];
    if ((cVar7 == '-') || (cVar7 == '+')) {
      sVar16 = sVar13 + 2;
      this_00->i = sVar16;
      cVar7 = pcVar2[sVar13 + 2];
    }
    if ((byte)(cVar7 - 0x30U) < 10) {
      do {
        sVar16 = sVar16 + 1;
        this_00->i = sVar16;
      } while ((byte)(pcVar2[sVar16] - 0x30U) < 10);
      goto LAB_0013a9ec;
    }
    local_108 = (undefined1  [8])(local_100 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_108,"at least one digit required in exponent","");
    _Var19 = (__shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>)
             fail(this,(string *)this_00);
  }
  else {
    local_108 = (undefined1  [8])(local_100 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_108,"exceeded maximum nesting depth","");
    _Var19 = (__shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>)
             fail(this,(string *)this_00);
  }
LAB_0013a286:
  local_c8._0_8_ = local_100._8_8_;
  auVar17 = local_108;
  if (local_108 == (undefined1  [8])(local_100 + 8)) {
    auVar26._0_8_ = _Var19._M_ptr;
    auVar26._8_8_ = _Var19._M_refcount._M_pi;
    return (Json)auVar26;
  }
LAB_0013a294:
  operator_delete((void *)auVar17,(ulong)((long)&(((string *)local_c8._0_8_)->_M_dataplus)._M_p + 1)
                 );
  _Var3._M_refcount._M_pi = extraout_RDX._M_pi;
  _Var3._M_ptr = extraout_RAX;
  return (shared_ptr<json11::JsonValue>)(shared_ptr<json11::JsonValue>)_Var3;
}

Assistant:

Json parse_json(int depth) {
        if (depth > max_depth) {
            return fail("exceeded maximum nesting depth");
        }

        char ch = get_next_token();
        if (failed)
            return Json();

        if (ch == '-' || (ch >= '0' && ch <= '9')) {
            i--;
            return parse_number();
        }

        if (ch == 't')
            return expect("true", true);

        if (ch == 'f')
            return expect("false", false);

        if (ch == 'n')
            return expect("null", Json());

        if (ch == '"')
            return parse_string();

        if (ch == '{') {
            map<string, Json> data;
            ch = get_next_token();
            if (ch == '}')
                return data;

            while (1) {
                if (ch != '"')
                    return fail("expected '\"' in object, got " + esc(ch));

                string key = parse_string();
                if (failed)
                    return Json();

                ch = get_next_token();
                if (ch != ':')
                    return fail("expected ':' in object, got " + esc(ch));

                data[std::move(key)] = parse_json(depth + 1);
                if (failed)
                    return Json();

                ch = get_next_token();
                if (ch == '}')
                    break;
                if (ch != ',')
                    return fail("expected ',' in object, got " + esc(ch));

                ch = get_next_token();
            }
            return data;
        }

        if (ch == '[') {
            vector<Json> data;
            ch = get_next_token();
            if (ch == ']')
                return data;

            while (1) {
                i--;
                data.push_back(parse_json(depth + 1));
                if (failed)
                    return Json();

                ch = get_next_token();
                if (ch == ']')
                    break;
                if (ch != ',')
                    return fail("expected ',' in list, got " + esc(ch));

                ch = get_next_token();
                (void)ch;
            }
            return data;
        }

        return fail("expected value, got " + esc(ch));
    }